

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Mode5InterrogatorBasicData
          (Mode5InterrogatorBasicData *this,Mode5InterrogatorStatus *Status,KUINT32 FormatsPresent,
          EntityIdentifier *ID)

{
  EntityIdentifier *ID_local;
  KUINT32 FormatsPresent_local;
  Mode5InterrogatorStatus *Status_local;
  Mode5InterrogatorBasicData *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5InterrogatorBasicData_0032f810;
  Mode5InterrogatorStatus::Mode5InterrogatorStatus(&this->m_Status,Status);
  this->m_ui8Padding = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui32MsgFormats = FormatsPresent;
  EntityIdentifier::EntityIdentifier(&this->m_InterrogatedID,ID);
  this->m_ui16Padding2 = 0;
  return;
}

Assistant:

Mode5InterrogatorBasicData::Mode5InterrogatorBasicData( const Mode5InterrogatorStatus & Status, KUINT32 FormatsPresent, const EntityIdentifier & ID ) :
	m_Status( Status ),
	m_ui8Padding( 0 ),
	m_ui16Padding1( 0 ),
	m_ui32MsgFormats( FormatsPresent ),
	m_InterrogatedID( ID ),
	m_ui16Padding2( 0 )
{
}